

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

Option<Catch::GroupInfo> * __thiscall
Catch::Option<Catch::GroupInfo>::operator=(Option<Catch::GroupInfo> *this,GroupInfo *_value)

{
  GroupInfo *_value_local;
  Option<Catch::GroupInfo> *this_local;
  
  reset(this);
  GroupInfo::GroupInfo((GroupInfo *)this->storage,_value);
  this->nullableValue = (GroupInfo *)this->storage;
  return this;
}

Assistant:

Option& operator = ( T const& _value ) {
            reset();
            nullableValue = new( storage ) T( _value );
            return *this;
        }